

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

bool_t botpTOTPStepV(char *otp,tm_time_t t,void *state)

{
  int iVar1;
  char *in_RDX;
  void *in_RSI;
  tm_time_t in_RDI;
  char *unaff_retaddr;
  botp_totp_st *st;
  char *in_stack_ffffffffffffffd8;
  
  botpTOTPStepR(unaff_retaddr,in_RDI,in_RSI);
  iVar1 = strCmp(in_RDX,in_stack_ffffffffffffffd8);
  return (bool_t)(iVar1 == 0);
}

Assistant:

bool_t botpTOTPStepV(const char* otp, tm_time_t t, void* state)
{
	botp_totp_st* st = (botp_totp_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(t != TIME_ERR);
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpTOTP_keep()));
	// вычислить и проверить пароль
	botpTOTPStepR(st->otp, t, state);
	return strEq(st->otp, otp);
}